

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  DiskInterface *this_00;
  Metrics *this_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  reference ppNVar6;
  string *psVar7;
  ulong uVar8;
  pointer pCVar9;
  __enable_if_t<is_constructible<value_type,_pair<Edge_*,_long>_>::value,_pair<iterator,_bool>_>
  _Var10;
  Metric *local_1a0;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string content;
  string rspfile;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_a8;
  iterator o;
  pair<Edge_*,_long> local_90;
  long local_80;
  int64_t start_time_millis;
  undefined1 local_70 [8];
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  Edge *edge_local;
  Builder *this_local;
  
  local_28 = err;
  err_local = (string *)edge;
  edge_local = (Edge *)this;
  if ((StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric),
     this_01 = g_metrics, iVar3 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_1a0 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"StartEdge",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_1a0 = Metrics::NewMetric(this_01,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    StartEdge::metrics_h_metric = local_1a0;
    __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)local_70,StartEdge::metrics_h_metric);
  bVar1 = Edge::is_phony((Edge *)err_local);
  if (bVar1) {
    this_local._7_1_ = 1;
    start_time_millis._4_4_ = 1;
    goto LAB_0011073c;
  }
  iVar5 = GetTimeMillis();
  local_80 = iVar5 - this->start_time_millis_;
  local_90 = std::make_pair<Edge*&,long&>((Edge **)&err_local,&local_80);
  _Var10 = std::
           map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
           ::insert<std::pair<Edge*,long>>
                     ((map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                       *)&this->running_edges_,&local_90);
  o._M_current = (Node **)_Var10.first._M_node;
  (*this->status_->_vptr_Status[1])(this->status_,err_local,local_80);
  local_a8._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                          ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local[1]._M_string_length
                          );
  while( true ) {
    rspfile.field_2._8_8_ =
         std::vector<Node_*,_std::allocator<Node_*>_>::end
                   ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local[1]._M_string_length);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a8,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       ((long)&rspfile.field_2 + 8));
    if (!bVar1) break;
    this_00 = this->disk_interface_;
    ppNVar6 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_a8);
    psVar7 = Node::path_abi_cxx11_(*ppNVar6);
    bVar1 = DiskInterface::MakeDirs(this_00,psVar7);
    if (!bVar1) {
      this_local._7_1_ = 0;
      start_time_millis._4_4_ = 1;
      goto LAB_0011073c;
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_a8);
  }
  Edge::GetUnescapedRspfile_abi_cxx11_((string *)((long)&content.field_2 + 8),(Edge *)err_local);
  uVar8 = std::__cxx11::string::empty();
  psVar7 = err_local;
  if ((uVar8 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"rspfile_content",&local_111);
    Edge::GetBinding((string *)local_f0,(Edge *)psVar7,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    bVar2 = (**(code **)(*(long *)this->disk_interface_ + 0x28))
                      (this->disk_interface_,(undefined1 *)((long)&content.field_2 + 8),local_f0);
    bVar1 = (bVar2 & 1) == 0;
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    start_time_millis._4_4_ = (uint)bVar1;
    std::__cxx11::string::~string((string *)local_f0);
    if (start_time_millis._4_4_ == 0) goto LAB_00110600;
  }
  else {
LAB_00110600:
    pCVar9 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    uVar4 = (*pCVar9->_vptr_CommandRunner[4])(pCVar9,err_local);
    psVar7 = local_28;
    if ((uVar4 & 1) == 0) {
      Edge::EvaluateCommand_abi_cxx11_(&local_178,(Edge *)err_local,false);
      std::operator+(&local_158,"command \'",&local_178);
      std::operator+(&local_138,&local_158,"\' failed.");
      std::__cxx11::string::assign((string *)psVar7);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      this_local._7_1_ = 0;
      start_time_millis._4_4_ = 1;
    }
    else {
      this_local._7_1_ = 1;
      start_time_millis._4_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
LAB_0011073c:
  ScopedMetric::~ScopedMetric((ScopedMetric *)local_70);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  int64_t start_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.insert(make_pair(edge, start_time_millis));

  status_->BuildEdgeStarted(edge, start_time_millis);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}